

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<1>::operator()
          (_defaultInitializer<1> *this,shared_ptr<Assimp::Blender::GroupObject> *out,char *reason)

{
  Logger *this_00;
  _defaultInitializer<0> local_11;
  
  this_00 = DefaultLogger::get();
  Logger::warn(this_00,reason);
  _defaultInitializer<0>::operator()(&local_11,out,(char *)0x0);
  return;
}

Assistant:

void operator ()(T& out, const char* reason = "<add reason>") {
        ASSIMP_LOG_WARN(reason);

        // ... and let the show go on
        _defaultInitializer<0 /*ErrorPolicy_Igno*/>()(out);
    }